

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapParser.cpp
# Opt level: O2

string * rc::detail::anon_unknown_0::pairToString
                   (string *__return_storage_ptr__,
                   pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *pair,bool doubleQuote)

{
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if ((pair->second)._M_string_length == 0) {
    maybeQuoteString(__return_storage_ptr__,&pair->first,doubleQuote);
  }
  else {
    maybeQuoteString(&local_40,&pair->first,doubleQuote);
    std::operator+(&local_60,&local_40,'=');
    maybeQuoteString(&local_80,&pair->second,doubleQuote);
    std::operator+(__return_storage_ptr__,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string pairToString(const std::pair<std::string, std::string> &pair,
                         bool doubleQuote) {
  if (pair.second.empty()) {
    return maybeQuoteString(pair.first, doubleQuote);
  } else {
    return maybeQuoteString(pair.first, doubleQuote) + '=' +
        maybeQuoteString(pair.second, doubleQuote);
  }
}